

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O1

double Minisat::memUsed(void)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  int value;
  char name [256];
  int local_114;
  double local_110;
  char local_108 [256];
  
  uVar1 = getpid();
  sprintf(local_108,"/proc/%d/statm",(ulong)uVar1);
  __stream = fopen(local_108,"rb");
  if (__stream == (FILE *)0x0) {
    local_110 = 0.0;
  }
  else {
    iVar2 = __isoc99_fscanf(__stream,"%d",&local_114);
    if (iVar2 != 1) {
      puts("ERROR! Failed to parse memory statistics from \"/proc\".");
      exit(1);
    }
    fclose(__stream);
    local_110 = (double)local_114;
  }
  iVar2 = getpagesize();
  return (double)iVar2 * local_110 * 9.5367431640625e-07;
}

Assistant:

static inline int memReadStat(int field)
{
    char  name[256];
    pid_t pid = getpid();
    int   value;

    sprintf(name, "/proc/%d/statm", pid);
    FILE* in = fopen(name, "rb");
    if (in == NULL) return 0;

    for (; field >= 0; field--)
        if (fscanf(in, "%d", &value) != 1)
            printf("ERROR! Failed to parse memory statistics from \"/proc\".\n"), exit(1);
    fclose(in);
    return value;
}